

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
DBlockThingsIterator::DBlockThingsIterator
          (DBlockThingsIterator *this,double checkx,double checky,double checkz,double checkh,
          double checkradius,bool ignorerestricted,sector_t *newsec)

{
  sector_t *newsec_local;
  bool ignorerestricted_local;
  double checkradius_local;
  double checkh_local;
  double checkz_local;
  double checky_local;
  double checkx_local;
  DBlockThingsIterator *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f7f58;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&this->super_FMultiBlockThingsIterator,&this->check,checkx,checky,checkz,checkh,
             checkradius,ignorerestricted,newsec);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f7f58;
  FPortalGroupArray::FPortalGroupArray(&this->check,1);
  FMultiBlockThingsIterator::CheckResult::CheckResult(&this->cres);
  (this->cres).thing = (AActor *)0x0;
  TVector3<double>::Zero(&(this->cres).Position);
  (this->cres).portalflags = 0;
  return;
}

Assistant:

DBlockThingsIterator(double checkx, double checky, double checkz, double checkh, double checkradius, bool ignorerestricted, sector_t *newsec)
		: FMultiBlockThingsIterator(check, checkx, checky, checkz, checkh, checkradius, ignorerestricted, newsec)
	{
		cres.thing = nullptr;
		cres.Position.Zero();
		cres.portalflags = 0;
	}